

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QNtlmBuffer *b)

{
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  quint32 *in_stack_ffffffffffffffe8;
  
  QDataStream::operator>>(in_RSI,(quint16 *)in_stack_ffffffffffffffe8);
  QDataStream::operator>>(in_RSI,(quint16 *)in_stack_ffffffffffffffe8);
  QDataStream::operator>>(in_RSI,in_stack_ffffffffffffffe8);
  return in_RDI;
}

Assistant:

static QDataStream& operator>>(QDataStream& s, QNtlmBuffer& b)
{
    s >> b.len >> b.maxLen >> b.offset;
    return s;
}